

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NearestNeighbors.pb.h
# Opt level: O2

SquaredEuclideanDistance * __thiscall
CoreML::Specification::NearestNeighborsIndex::mutable_squaredeuclideandistance
          (NearestNeighborsIndex *this)

{
  SquaredEuclideanDistance *this_00;
  
  if (this->_oneof_case_[1] == 200) {
    this_00 = (this->DistanceFunction_).squaredeuclideandistance_;
  }
  else {
    clear_DistanceFunction(this);
    this->_oneof_case_[1] = 200;
    this_00 = (SquaredEuclideanDistance *)operator_new(0x18);
    SquaredEuclideanDistance::SquaredEuclideanDistance(this_00);
    (this->DistanceFunction_).squaredeuclideandistance_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::SquaredEuclideanDistance* NearestNeighborsIndex::mutable_squaredeuclideandistance() {
  if (!has_squaredeuclideandistance()) {
    clear_DistanceFunction();
    set_has_squaredeuclideandistance();
    DistanceFunction_.squaredeuclideandistance_ = new ::CoreML::Specification::SquaredEuclideanDistance;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NearestNeighborsIndex.squaredEuclideanDistance)
  return DistanceFunction_.squaredeuclideandistance_;
}